

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr.c
# Opt level: O2

int32 compute_mllr(float32 *****regl,float32 ****regr,uint32 *veclen,uint32 nclass,uint32 nfeat,
                  uint32 mllrmult,uint32 mllradd,float32 *****A,float32 ****B)

{
  uint n;
  float32 *pfVar1;
  int32 iVar2;
  float32 ****ppppfVar3;
  float32 ***pppfVar4;
  float32 **ppfVar5;
  float32 *pfVar6;
  ulong uVar7;
  ulong uVar8;
  ulong d1;
  ulong uVar9;
  ulong d1_00;
  ulong d2;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  float32 fVar13;
  float fVar14;
  
  d1 = (ulong)nclass;
  d2 = (ulong)nfeat;
  ppppfVar3 = (float32 ****)
              __ckd_calloc_2d__(d1,d2,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                                ,0x6f);
  pppfVar4 = (float32 ***)
             __ckd_calloc_2d__(d1,d2,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                               ,0x70);
  bVar11 = mllradd == 0;
  bVar12 = mllrmult != 0;
  uVar10 = 0;
  do {
    if (uVar10 == d1) {
      *A = ppppfVar3;
      *B = pppfVar4;
      return 0;
    }
    for (uVar9 = 0; uVar9 != d2; uVar9 = uVar9 + 1) {
      n = veclen[uVar9];
      d1_00 = (ulong)n;
      ppfVar5 = (float32 **)
                __ckd_calloc_2d__(d1_00,d1_00,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                                  ,0x84);
      ppppfVar3[uVar10][uVar9] = ppfVar5;
      pfVar6 = (float32 *)
               __ckd_calloc__(d1_00,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                              ,0x85);
      pppfVar4[uVar10][uVar9] = pfVar6;
      pfVar6 = (float32 *)
               __ckd_calloc__((ulong)(n + 1),8,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                              ,0x86);
      if (bVar12 && bVar11) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                ,0x8a,"Computing only multiplicative part of MLLR\n");
        for (uVar7 = 0; d1_00 != uVar7; uVar7 = uVar7 + 1) {
          pppfVar4[uVar10][uVar9][uVar7] = 0.0;
        }
        for (uVar7 = 0; uVar7 != d1_00; uVar7 = uVar7 + 1) {
          iVar2 = solve(regl[uVar10][uVar9][uVar7],regr[uVar10][uVar9][uVar7],pfVar6,n);
          if (iVar2 == 0) {
            pfVar1 = ppppfVar3[uVar10][uVar9][uVar7];
            for (uVar8 = 0; d1_00 != uVar8; uVar8 = uVar8 + 1) {
              pfVar1[uVar8] = pfVar6[uVar8];
            }
          }
          else {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                    ,0x92,"Estimation of %d th multiplicative"," term in MLLR regression failed\n",
                    uVar7 & 0xffffffff);
            pfVar1 = ppppfVar3[uVar10][uVar9][uVar7];
            for (uVar8 = 0; d1_00 != uVar8; uVar8 = uVar8 + 1) {
              pfVar1[uVar8] = 0.0;
            }
            pfVar1[uVar7] = 1.0;
          }
        }
      }
      else if (bVar12 || bVar11) {
        if (!bVar12 || bVar11) {
          if (mllradd == 0 && mllrmult == 0) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                    ,0xcb,"ERROR: MLLR flags are not set\n");
            exit(1);
          }
        }
        else {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                  ,0xb6,"Computing both multiplicative and additive part of MLLR\n");
          for (uVar7 = 0; uVar7 != d1_00; uVar7 = uVar7 + 1) {
            iVar2 = solve(regl[uVar10][uVar9][uVar7],regr[uVar10][uVar9][uVar7],pfVar6,n + 1);
            if (iVar2 == 0) {
              pfVar1 = ppppfVar3[uVar10][uVar9][uVar7];
              for (uVar8 = 0; d1_00 != uVar8; uVar8 = uVar8 + 1) {
                pfVar1[uVar8] = pfVar6[uVar8];
              }
              fVar13 = pfVar6[d1_00];
            }
            else {
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                      ,0xba,"Estimation of %d th regression in MLLR failed\n",uVar7 & 0xffffffff);
              pfVar1 = ppppfVar3[uVar10][uVar9][uVar7];
              for (uVar8 = 0; d1_00 != uVar8; uVar8 = uVar8 + 1) {
                pfVar1[uVar8] = 0.0;
              }
              pfVar1[uVar7] = 1.0;
              fVar13 = 0.0;
            }
            pppfVar4[uVar10][uVar9][uVar7] = fVar13;
          }
        }
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                ,0xa1,"Computing only additive part of MLLR\n");
        for (uVar7 = 0; uVar7 != d1_00; uVar7 = uVar7 + 1) {
          pfVar1 = ppppfVar3[uVar10][uVar9][uVar7];
          for (uVar8 = 0; d1_00 != uVar8; uVar8 = uVar8 + 1) {
            pfVar1[uVar8] = 0.0;
          }
          pfVar1[uVar7] = 1.0;
        }
        for (uVar7 = 0; d1_00 != uVar7; uVar7 = uVar7 + 1) {
          fVar14 = (float)regl[uVar10][uVar9][uVar7][d1_00][d1_00];
          if (fVar14 <= 1.2e-38) {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr.c"
                    ,0xaf,
                    "%th dimension of addition term of %dth MLLR adaptation underflow!\nSet to zero...\n"
                    ,uVar7 & 0xffffffff);
            fVar14 = 0.0;
          }
          else {
            fVar14 = ((float)regr[uVar10][uVar9][uVar7][d1_00] -
                     (float)regl[uVar10][uVar9][uVar7][d1_00][uVar7]) / fVar14;
          }
          pppfVar4[uVar10][uVar9][uVar7] = (float32)fVar14;
        }
      }
      ckd_free(pfVar6);
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

int32
compute_mllr (
             float32 *****regl,
             float32 ****regr,
             const uint32  *veclen,
             uint32  nclass,
             uint32  nfeat,
             uint32  mllrmult,
             uint32  mllradd,
             float32 *****A,
             float32 ****B
            )
{
    uint32  i,j,k,m,len;
    float32 ****Aloc, ***Bloc;
    float32 *ABloc=NULL;

    Aloc = (float32 ****) ckd_calloc_2d(nclass, nfeat, sizeof(float32 ***));
    Bloc = (float32 ***) ckd_calloc_2d(nclass, nfeat, sizeof(float32 **));

#if 0
    dump_regmat_statistics(regl,
			   regr,
			   nclass,
			   nfeat
			   veclen);

#endif
    /* Here, regl is the same as Legetter's G, while regr is Z.  The
     * original papers use the formula w_i^T = G(i)^{-1} z_i^T to
     * calculate the rows of W (the transformation matrix).  However
     * what they really mean by this is that we solve for w_i^T in the
     * equation G(i) w_i^T = z_i^T.  That is what this code does,
     * optionally omitting the bias or rotation parts of W. */
    for (m = 0; m < nclass; m++) {
	for (i = 0; i < nfeat; i++) {
	    len = veclen[i];

	    Aloc[m][i] = (float32 **) ckd_calloc_2d(len, len, sizeof(float32));
	    Bloc[m][i] = (float32 *) ckd_calloc(len, sizeof(float32));
	    ABloc = (float32 *) ckd_calloc(len+1, sizeof(float64));
 
	    if (mllrmult && !mllradd) {
		/* Compute only multiplicative part of MLLR*/
		E_INFO("Computing only multiplicative part of MLLR\n"); 
		for (j = 0; j < len; j++) {
		    Bloc[m][i][j] = 0.0;
		}
		for (j = 0; j < len; ++j) {
		    /** If estimation of rotation not possible, dont rotate **/
		    if (solve(regl[m][i][j],regr[m][i][j],ABloc,len) != S3_SUCCESS){
			E_INFO("Estimation of %d th multiplicative",
			       " term in MLLR regression failed\n",j);
			for (k = 0;k < len; k++) {
			    Aloc[m][i][j][k] = 0.0;
			}
			Aloc[m][i][j][j] = 1.0;
		    }
		    else {
			for (k = 0; k < len; k++) {
			    Aloc[m][i][j][k] = ABloc[k];
			}
		    }
		}
	    }
	    else if(!mllrmult && mllradd){
		/* Compute only additive part of MLLR*/
		E_INFO("Computing only additive part of MLLR\n"); 
		for (j = 0; j < len; j++) {
		    for (k = 0; k < len; k++) {
			Aloc[m][i][j][k] = 0.0;
		    }
		    Aloc[m][i][j][j] = 1.0;
		}
		for (j = 0; j < len; j++) {
		    /** If estimation of shift not possible, dont shift **/
		    if (regl[m][i][j][len][len] > MIN_IEEE_NORM_POS_FLOAT32) {
			Bloc[m][i][j] = (regr[m][i][j][len]-regl[m][i][j][len][j])/
			    regl[m][i][j][len][len];
		    }
		    else {
			E_INFO("%th dimension of addition term of %dth MLLR adaptation underflow!\nSet to zero...\n",j);
			Bloc[m][i][j] = 0.0;
		    }
		}
	    }
	    else if (mllrmult && mllradd) {
		/* Compute both multiplicative and additive part of MLLR*/
		E_INFO("Computing both multiplicative and additive part of MLLR\n");
		for (j = 0; j < len; ++j) {
		    /** If estimation of regression not possible, dont do anything **/
		    if (solve(regl[m][i][j],regr[m][i][j],ABloc,len+1) != S3_SUCCESS) {
			E_INFO("Estimation of %d th regression in MLLR failed\n",j);
			for (k = 0;k < len; k++) {
			    Aloc[m][i][j][k] = 0.0;
			}
			Aloc[m][i][j][j] = 1.0;
			Bloc[m][i][j] = 0.0;
		    }
		    else {
			for (k = 0; k < len; ++k) {
			    Aloc[m][i][j][k] = ABloc[k];
			}
			Bloc[m][i][j] = ABloc[len];
		    }
		}
	    }
	    else if(!mllrmult && !mllradd){
		/*MLLR flags are not set - Error*/
		E_FATAL("ERROR: MLLR flags are not set\n"); 
	    }
	    ckd_free(ABloc);
	}
    }
    *A = Aloc;
    *B = Bloc;

    return S3_SUCCESS;
}